

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O2

void __thiscall
mp::pre::
RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::PresolveBasisEntry
          (RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
           *this,LinkEntry *be)

{
  int i;
  
  i = BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
      ::GetInt(&this->
                super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
               ,be,0);
  if (i == 3) {
    i = 4;
  }
  else if (i == 4) {
    i = 3;
  }
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  ::SetInt(&this->
            super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           ,be,2,i);
  BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
  ::SetInt(&this->
            super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           ,be,1,5);
  return;
}

Assistant:

void PresolveBasisEntry(const typename Base::LinkEntry& be) {
    SetInt(be, VAR_SLK, ReverseBasisLowUpp( GetInt(be, CON_SRC)) );
    SetInt(be, CON_TARGET, (int)BasicStatus::equ);
  }